

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

Reader * __thiscall Reader::compile(Reader *this)

{
  Ant *pAVar1;
  pointer pbVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  Command *pCVar6;
  undefined8 uVar7;
  ulong uVar8;
  Ant *this_00;
  bool bVar9;
  string current;
  string arg;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  vector<Gate,_std::allocator<Gate>_> *local_f8;
  vector<Pheromone,_std::allocator<Pheromone>_> *local_f0;
  undefined1 local_e8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  pointer local_b0;
  pointer local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  vector<int,_std::allocator<int>_> *local_70;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_f0 = &this->phrs;
  local_f8 = &this->gts;
  local_70 = &this->stack;
  do {
    pAVar1 = (this->nts).super__Vector_base<Ant,_std::allocator<Ant>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (this_00 = (this->nts).super__Vector_base<Ant,_std::allocator<Ant>_>._M_impl.
                   super__Vector_impl_data._M_start; bVar3 = this_00 != pAVar1, bVar3;
        this_00 = this_00 + 1) {
      Ant::step(this_00,&this->wls,local_f0,local_f8);
      uVar8 = (ulong)this_00->y;
      if (((((long)uVar8 < 0) ||
           (pbVar2 = (this->lns).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
           (ulong)((long)(this->lns).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <= uVar8))
          || ((long)this_00->x < 0)) || (pbVar2[uVar8]._M_string_length <= (ulong)(long)this_00->x))
      {
        bVar9 = false;
      }
      else {
        if (pbVar2[this_00->y]._M_string_length <= (ulong)(long)this_00->x) {
LAB_001054b8:
          std::__throw_out_of_range_fmt
                    ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
LAB_001054c6:
          uVar7 = std::__throw_out_of_range_fmt
                            ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,
                            CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                     local_90.field_2._M_local_buf[0]) + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_48);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,
                            CONCAT62(local_118.field_2._M_allocated_capacity._2_6_,
                                     CONCAT11(local_118.field_2._M_local_buf[1],
                                              local_118.field_2._M_local_buf[0])) + 1);
          }
          _Unwind_Resume(uVar7);
        }
        local_118.field_2._M_local_buf[0] = pbVar2[this_00->y]._M_dataplus._M_p[this_00->x];
        local_118._M_string_length = 1;
        local_118.field_2._M_local_buf[1] = '\0';
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_118,"q");
        if (iVar5 == 0) {
          bVar9 = false;
        }
        else {
          iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&local_118,"z");
          if (iVar5 == 0) {
            bVar9 = true;
            if ((this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish[-1] == 0) {
              Ant::updatePh(this_00,&this->wls,local_f0,local_f8);
            }
          }
          else {
            std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                      ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_68,"[A-Za-z]",
                       0x10);
            local_e8._16_8_ = (pointer)0x0;
            local_e8._24_8_ = (char *)0x0;
            local_e8._0_8_ = (pointer)0x0;
            local_e8._8_8_ = (pointer)0x0;
            bVar4 = std::__detail::
                    __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )local_118._M_dataplus._M_p,
                               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )(local_118._M_dataplus._M_p + local_118._M_string_length),
                               (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                *)local_e8,
                               (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_68,0);
            if ((pointer)local_e8._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_e8._0_8_,local_e8._16_8_ - local_e8._0_8_);
            }
            std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                      ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_68);
            bVar9 = true;
            if (bVar4) {
              local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_68,local_118._M_dataplus._M_p,
                         local_118._M_dataplus._M_p + local_118._M_string_length);
              Ant::step(this_00,&this->wls,local_f0,local_f8);
              pbVar2 = (this->lns).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (((ulong)(0 < (long)this_00->y) <
                   (ulong)((long)(this->lns).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5)) &&
                 ((ulong)(0 < this_00->x) < pbVar2[this_00->y]._M_string_length)) {
                if (pbVar2[this_00->y]._M_string_length <= (ulong)(long)this_00->x)
                goto LAB_001054c6;
                local_e8._8_8_ = (pointer)0x1;
                local_e8[0x11] = 0;
                local_e8[0x10] = pbVar2[this_00->y]._M_dataplus._M_p[this_00->x];
                local_e8._0_8_ = (pointer)(local_e8 + 0x10);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=(&local_118,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_e8);
                if ((pointer)local_e8._0_8_ != (pointer)(local_e8 + 0x10)) {
                  operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
                }
                local_48.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_48.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_48.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
                local_90._M_string_length = 0;
                local_90.field_2._M_local_buf[0] = '\0';
                while( true ) {
                  iVar5 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                    (&local_118,"`");
                  bVar9 = iVar5 == 0;
                  if (bVar9) break;
                  Ant::step(this_00,&this->wls,local_f0,local_f8);
                  pbVar2 = (this->lns).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  if (((ulong)((long)(this->lns).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5)
                       <= (ulong)(0 < (long)this_00->y)) ||
                     (pbVar2[this_00->y]._M_string_length <= (ulong)(0 < this_00->x)))
                  goto LAB_00105412;
                  iVar5 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                    (&local_118,";");
                  if (iVar5 == 0) {
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back(&local_48,&local_90);
                    local_e8._0_8_ = local_e8 + 0x10;
                    local_e8._8_8_ = (pointer)0x0;
                    local_e8._16_8_ = local_e8._16_8_ & 0xffffffffffffff00;
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::operator=(&local_90,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_e8);
                    if ((pointer)local_e8._0_8_ != (pointer)(local_e8 + 0x10)) {
                      operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
                    }
                  }
                  else {
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::_M_append(&local_90,local_118._M_dataplus._M_p,local_118._M_string_length);
                  }
                  pbVar2 = (this->lns).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  if (((ulong)((long)(this->lns).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5)
                       <= (ulong)(0 < (long)this_00->y)) ||
                     (pbVar2[this_00->y]._M_string_length <= (ulong)(0 < this_00->x)))
                  goto LAB_00105412;
                  if (pbVar2[this_00->y]._M_string_length <= (ulong)(long)this_00->x) {
                    std::__throw_out_of_range_fmt
                              ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)"
                              );
                    goto LAB_001054b8;
                  }
                  local_e8._8_8_ = (pointer)0x1;
                  local_e8[0x11] = 0;
                  local_e8[0x10] = pbVar2[this_00->y]._M_dataplus._M_p[this_00->x];
                  local_e8._0_8_ = (pointer)(local_e8 + 0x10);
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator=(&local_118,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_e8);
                  if ((pointer)local_e8._0_8_ != (pointer)(local_e8 + 0x10)) {
                    operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
                  }
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&local_48,&local_90);
                Command::Command((Command *)local_e8,&local_68,&local_48,local_70);
                pCVar6 = Command::execute((Command *)local_e8);
                std::vector<int,_std::allocator<int>_>::operator=(local_70,&pCVar6->stack);
                if (local_b0 != (pointer)0x0) {
                  operator_delete(local_b0,(long)local_a0 - (long)local_b0);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_c8);
                if ((pointer)local_e8._0_8_ != (pointer)(local_e8 + 0x10)) {
                  operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
                }
LAB_00105412:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_90._M_dataplus._M_p != &local_90.field_2) {
                  operator_delete(local_90._M_dataplus._M_p,
                                  CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                           local_90.field_2._M_local_buf[0]) + 1);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_48);
              }
              else {
                bVar9 = false;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68._M_dataplus._M_p != &local_68.field_2) {
                operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1
                               );
              }
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,
                          CONCAT62(local_118.field_2._M_allocated_capacity._2_6_,
                                   CONCAT11(local_118.field_2._M_local_buf[1],
                                            local_118.field_2._M_local_buf[0])) + 1);
        }
      }
      if (!bVar9) break;
    }
    if (bVar3) {
      return this;
    }
  } while( true );
}

Assistant:

Reader& compile() {
            while (true) {
                for (Ant & ant : nts) {
                    ant.step(wls, phrs, gts);
                    if (0 > ant.y || ant.y >= lns.size() || 0 > ant.x || ant.x >= lns[ant.y].size())
                        return *this;
                    string current(1, lns[ant.y].at(ant.x));
                    if (current == "q") return *this;
                    else if (current == "z") {
                        if (stack[stack.size() - 1] == 0) { ant.updatePh(wls, phrs, gts); }
                    }
                    else if (regex_match(current, regex("[A-Za-z]"))) {
                        string name = current;
                        ant.step(wls, phrs, gts);
                        if (0 < ant.y >= lns.size() || 0 < ant.x >= lns[ant.y].size())
                            return *this;
                        current = string(1, lns[ant.y].at(ant.x));
                        vector<string> args;
                        string arg;
                        while (current != "`") {
                            ant.step(wls, phrs, gts);
                            if (0 < ant.y >= lns.size() || 0 < ant.x >= lns[ant.y].size())
                                return *this;
                            if (current == ";") {
                                args.push_back(arg);
                                arg = string();
                            } else
                                arg.append(current);
                            if (0 < ant.y >= lns.size() || 0 < ant.x >= lns[ant.y].size())
                                return *this;
                            current = string(1, lns[ant.y].at(ant.x));
                        } args.push_back(arg);
                        stack = Command(name, args, stack).execute().getStack();
                    }
                }
            }
        }